

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

int ndiPVWRFromFile(ndicapi *pol,int port,char *filename)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  char cVar12;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar34 [15];
  undefined1 auVar35 [14];
  undefined1 auVar36 [15];
  ushort uVar37;
  ushort uVar38;
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  unkuint9 Var45;
  undefined1 auVar46 [11];
  undefined1 auVar47 [13];
  undefined1 auVar48 [14];
  unkbyte10 Var49;
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  uint6 uVar52;
  int iVar53;
  FILE *__stream;
  long lVar54;
  ulong uVar55;
  char *tcp;
  int iVar56;
  char *__s;
  byte bVar59;
  ushort uVar58;
  undefined1 auVar57 [16];
  short sVar60;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  short sVar68;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  char hexdata [128];
  uchar buffer [1024];
  char local_4b8 [1160];
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  undefined4 uVar61;
  undefined6 uVar62;
  undefined8 uVar63;
  undefined1 auVar64 [12];
  undefined1 auVar65 [14];
  undefined4 uVar69;
  undefined6 uVar70;
  undefined8 uVar71;
  undefined1 auVar72 [12];
  undefined1 auVar73 [14];
  
  pol->ErrorCode = 0;
  __stream = fopen(filename,"rb");
  iVar56 = -1;
  if (__stream != (FILE *)0x0) {
    __s = local_4b8 + 0x80;
    memset(__s,0,0x400);
    fread(__s,1,0x400,__stream);
    iVar53 = ferror(__stream);
    fclose(__stream);
    if (iVar53 == 0) {
      uVar55 = 0;
      do {
        lVar54 = 0;
        do {
          uVar2 = *(ulong *)(__s + lVar54);
          bVar59 = (byte)(uVar2 >> 0x38);
          auVar34._8_6_ = 0;
          auVar34._0_8_ = uVar2;
          auVar34[0xe] = bVar59;
          auVar36._8_4_ = 0;
          auVar36._0_8_ = uVar2;
          auVar36[0xc] = (char)(uVar2 >> 0x30);
          auVar36._13_2_ = auVar34._13_2_;
          auVar39._8_4_ = 0;
          auVar39._0_8_ = uVar2;
          auVar39._12_3_ = auVar36._12_3_;
          auVar40._8_2_ = 0;
          auVar40._0_8_ = uVar2;
          auVar40[10] = (char)(uVar2 >> 0x28);
          auVar40._11_4_ = auVar39._11_4_;
          auVar41._8_2_ = 0;
          auVar41._0_8_ = uVar2;
          auVar41._10_5_ = auVar40._10_5_;
          auVar42[8] = (char)(uVar2 >> 0x20);
          auVar42._0_8_ = uVar2;
          auVar42._9_6_ = auVar41._9_6_;
          auVar44._7_8_ = 0;
          auVar44._0_7_ = auVar42._8_7_;
          Var45 = CONCAT81(SUB158(auVar44 << 0x40,7),(char)(uVar2 >> 0x18));
          auVar50._9_6_ = 0;
          auVar50._0_9_ = Var45;
          auVar46._1_10_ = SUB1510(auVar50 << 0x30,5);
          auVar46[0] = (char)(uVar2 >> 0x10);
          auVar51._11_4_ = 0;
          auVar51._0_11_ = auVar46;
          auVar47._1_12_ = SUB1512(auVar51 << 0x20,3);
          auVar47[0] = (char)(uVar2 >> 8);
          auVar57._0_2_ = CONCAT11(0,(byte)uVar2);
          auVar43._2_13_ = auVar47;
          auVar43._0_2_ = auVar57._0_2_;
          auVar67._2_2_ = 0;
          auVar67._0_2_ = auVar42._8_2_;
          auVar67._4_2_ = auVar40._10_2_;
          auVar67._6_2_ = 0;
          auVar67._8_2_ = auVar36._12_2_;
          auVar67._10_2_ = 0;
          auVar67[0xc] = bVar59;
          auVar67._13_3_ = 0;
          uVar58 = (ushort)Var45;
          auVar35._10_2_ = 0;
          auVar35._0_10_ = auVar43._0_10_;
          auVar35._12_2_ = uVar58;
          uVar52 = CONCAT42(auVar35._10_4_,auVar46._0_2_);
          auVar48._6_8_ = 0;
          auVar48._0_6_ = uVar52;
          Var49 = CONCAT82(SUB148(auVar48 << 0x40,6),auVar47._0_2_);
          auVar57._2_2_ = 0;
          auVar57._4_10_ = Var49;
          auVar57._14_2_ = 0;
          auVar77._0_4_ = CONCAT31(0,(byte)uVar2 >> 4);
          auVar77._4_4_ = (uint)Var49 >> 4;
          auVar77._8_4_ = (uint)uVar52 >> 4;
          uVar58 = uVar58 >> 4;
          auVar77._12_2_ = uVar58;
          auVar77._14_2_ = 0;
          auVar80._0_4_ = CONCAT22(0,auVar42._8_2_ >> 4);
          uVar37 = auVar40._10_2_ >> 4;
          auVar80._4_2_ = uVar37;
          auVar80._6_2_ = 0;
          uVar38 = auVar36._12_2_ >> 4;
          auVar80._8_2_ = uVar38;
          auVar80._10_2_ = 0;
          auVar80[0xc] = bVar59 >> 4;
          auVar80._13_3_ = 0;
          auVar57 = auVar57 & _DAT_0010d000;
          auVar67 = auVar67 & _DAT_0010d000;
          auVar83 = auVar80 | _DAT_0010d010;
          auVar84 = auVar77 | _DAT_0010d010;
          auVar76 = auVar67 | _DAT_0010d010;
          auVar75 = auVar57 | _DAT_0010d010;
          auVar66._0_4_ = -(uint)(0x39 < auVar84._0_4_);
          auVar66._4_4_ = -(uint)(0x39 < auVar84._4_4_);
          auVar66._8_4_ = -(uint)(0x39 < auVar84._8_4_);
          auVar66._12_4_ = -(uint)(0x39 < auVar84._12_4_);
          auVar74._0_4_ = -(uint)(0x39 < auVar83._0_4_);
          auVar74._4_4_ = -(uint)(0x39 < auVar83._4_4_);
          auVar74._8_4_ = -(uint)(0x39 < auVar83._8_4_);
          auVar74._12_4_ = -(uint)(0x39 < auVar83._12_4_);
          auVar78._0_4_ = auVar77._0_4_ + 0x37;
          auVar78._4_4_ = auVar77._4_4_ + 0x37;
          auVar78._8_4_ = auVar77._8_4_ + 0x37;
          auVar78._12_4_ = uVar58 + 0x37;
          auVar81._0_4_ = auVar80._0_4_ + 0x37;
          auVar81._4_4_ = uVar37 + 0x37;
          auVar81._8_4_ = uVar38 + 0x37;
          auVar81._12_4_ = (bVar59 >> 4) + 0x37;
          auVar74 = ~auVar74 & auVar83 | auVar81 & auVar74;
          auVar66 = ~auVar66 & auVar84 | auVar78 & auVar66;
          auVar79._0_4_ = -(uint)(0x39 < auVar75._0_4_);
          auVar79._4_4_ = -(uint)(0x39 < auVar75._4_4_);
          auVar79._8_4_ = -(uint)(0x39 < auVar75._8_4_);
          auVar79._12_4_ = -(uint)(0x39 < auVar75._12_4_);
          auVar82._0_4_ = -(uint)(0x39 < auVar76._0_4_);
          auVar82._4_4_ = -(uint)(0x39 < auVar76._4_4_);
          auVar82._8_4_ = -(uint)(0x39 < auVar76._8_4_);
          auVar82._12_4_ = -(uint)(0x39 < auVar76._12_4_);
          auVar83._0_4_ = auVar57._0_4_ + 0x37;
          auVar83._4_4_ = auVar57._4_4_ + 0x37;
          auVar83._8_4_ = auVar57._8_4_ + 0x37;
          auVar83._12_4_ = auVar57._12_4_ + 0x37;
          auVar84._0_4_ = auVar67._0_4_ + 0x37;
          auVar84._4_4_ = auVar67._4_4_ + 0x37;
          auVar84._8_4_ = auVar67._8_4_ + 0x37;
          auVar84._12_4_ = auVar67._12_4_ + 0x37;
          auVar67 = ~auVar82 & auVar76 | auVar84 & auVar82;
          auVar57 = ~auVar79 & auVar75 | auVar83 & auVar79;
          sVar20 = auVar66._0_2_;
          cVar4 = (0 < sVar20) * (sVar20 < 0x100) * auVar66[0] - (0xff < sVar20);
          sVar20 = auVar66._2_2_;
          sVar60 = CONCAT11((0 < sVar20) * (sVar20 < 0x100) * auVar66[2] - (0xff < sVar20),cVar4);
          sVar20 = auVar57._0_2_;
          cVar5 = (0 < sVar20) * (sVar20 < 0x100) * auVar57[0] - (0xff < sVar20);
          sVar20 = auVar57._2_2_;
          uVar61 = CONCAT13((0 < sVar20) * (sVar20 < 0x100) * auVar57[2] - (0xff < sVar20),
                            CONCAT12(cVar5,sVar60));
          sVar20 = auVar66._4_2_;
          cVar6 = (0 < sVar20) * (sVar20 < 0x100) * auVar66[4] - (0xff < sVar20);
          sVar20 = auVar66._6_2_;
          uVar62 = CONCAT15((0 < sVar20) * (sVar20 < 0x100) * auVar66[6] - (0xff < sVar20),
                            CONCAT14(cVar6,uVar61));
          sVar20 = auVar57._4_2_;
          cVar7 = (0 < sVar20) * (sVar20 < 0x100) * auVar57[4] - (0xff < sVar20);
          sVar20 = auVar57._6_2_;
          uVar63 = CONCAT17((0 < sVar20) * (sVar20 < 0x100) * auVar57[6] - (0xff < sVar20),
                            CONCAT16(cVar7,uVar62));
          sVar20 = auVar66._8_2_;
          cVar8 = (0 < sVar20) * (sVar20 < 0x100) * auVar66[8] - (0xff < sVar20);
          sVar20 = auVar66._10_2_;
          auVar64._0_10_ =
               CONCAT19((0 < sVar20) * (sVar20 < 0x100) * auVar66[10] - (0xff < sVar20),
                        CONCAT18(cVar8,uVar63));
          sVar20 = auVar57._8_2_;
          cVar9 = (0 < sVar20) * (sVar20 < 0x100) * auVar57[8] - (0xff < sVar20);
          auVar64[10] = cVar9;
          sVar20 = auVar57._10_2_;
          auVar64[0xb] = (0 < sVar20) * (sVar20 < 0x100) * auVar57[10] - (0xff < sVar20);
          sVar20 = auVar66._12_2_;
          cVar10 = (0 < sVar20) * (sVar20 < 0x100) * auVar66[0xc] - (0xff < sVar20);
          auVar65[0xc] = cVar10;
          auVar65._0_12_ = auVar64;
          sVar20 = auVar66._14_2_;
          auVar65[0xd] = (0 < sVar20) * (sVar20 < 0x100) * auVar66[0xe] - (0xff < sVar20);
          sVar20 = auVar57._12_2_;
          cVar11 = (0 < sVar20) * (sVar20 < 0x100) * auVar57[0xc] - (0xff < sVar20);
          auVar75[0xe] = cVar11;
          auVar75._0_14_ = auVar65;
          sVar20 = auVar57._14_2_;
          auVar75[0xf] = (0 < sVar20) * (sVar20 < 0x100) * auVar57[0xe] - (0xff < sVar20);
          sVar20 = auVar74._0_2_;
          cVar12 = (0 < sVar20) * (sVar20 < 0x100) * auVar74[0] - (0xff < sVar20);
          sVar20 = auVar74._2_2_;
          sVar68 = CONCAT11((0 < sVar20) * (sVar20 < 0x100) * auVar74[2] - (0xff < sVar20),cVar12);
          sVar20 = auVar67._0_2_;
          cVar13 = (0 < sVar20) * (sVar20 < 0x100) * auVar67[0] - (0xff < sVar20);
          sVar20 = auVar67._2_2_;
          uVar69 = CONCAT13((0 < sVar20) * (sVar20 < 0x100) * auVar67[2] - (0xff < sVar20),
                            CONCAT12(cVar13,sVar68));
          sVar20 = auVar74._4_2_;
          cVar14 = (0 < sVar20) * (sVar20 < 0x100) * auVar74[4] - (0xff < sVar20);
          sVar20 = auVar74._6_2_;
          uVar70 = CONCAT15((0 < sVar20) * (sVar20 < 0x100) * auVar74[6] - (0xff < sVar20),
                            CONCAT14(cVar14,uVar69));
          sVar20 = auVar67._4_2_;
          cVar15 = (0 < sVar20) * (sVar20 < 0x100) * auVar67[4] - (0xff < sVar20);
          sVar20 = auVar67._6_2_;
          uVar71 = CONCAT17((0 < sVar20) * (sVar20 < 0x100) * auVar67[6] - (0xff < sVar20),
                            CONCAT16(cVar15,uVar70));
          sVar20 = auVar74._8_2_;
          cVar16 = (0 < sVar20) * (sVar20 < 0x100) * auVar74[8] - (0xff < sVar20);
          sVar20 = auVar74._10_2_;
          auVar72._0_10_ =
               CONCAT19((0 < sVar20) * (sVar20 < 0x100) * auVar74[10] - (0xff < sVar20),
                        CONCAT18(cVar16,uVar71));
          sVar20 = auVar67._8_2_;
          cVar17 = (0 < sVar20) * (sVar20 < 0x100) * auVar67[8] - (0xff < sVar20);
          auVar72[10] = cVar17;
          sVar20 = auVar67._10_2_;
          auVar72[0xb] = (0 < sVar20) * (sVar20 < 0x100) * auVar67[10] - (0xff < sVar20);
          sVar20 = auVar74._12_2_;
          cVar18 = (0 < sVar20) * (sVar20 < 0x100) * auVar74[0xc] - (0xff < sVar20);
          auVar73[0xc] = cVar18;
          auVar73._0_12_ = auVar72;
          sVar20 = auVar74._14_2_;
          auVar73[0xd] = (0 < sVar20) * (sVar20 < 0x100) * auVar74[0xe] - (0xff < sVar20);
          sVar20 = auVar67._12_2_;
          cVar19 = (0 < sVar20) * (sVar20 < 0x100) * auVar67[0xc] - (0xff < sVar20);
          auVar76[0xe] = cVar19;
          auVar76._0_14_ = auVar73;
          sVar20 = auVar67._14_2_;
          auVar76[0xf] = (0 < sVar20) * (sVar20 < 0x100) * auVar67[0xe] - (0xff < sVar20);
          sVar20 = (short)((uint)uVar61 >> 0x10);
          sVar21 = (short)((uint6)uVar62 >> 0x20);
          sVar22 = (short)((ulong)uVar63 >> 0x30);
          sVar23 = (short)((unkuint10)auVar64._0_10_ >> 0x40);
          sVar24 = auVar64._10_2_;
          sVar25 = auVar65._12_2_;
          sVar26 = auVar75._14_2_;
          sVar27 = (short)((uint)uVar69 >> 0x10);
          sVar28 = (short)((uint6)uVar70 >> 0x20);
          sVar29 = (short)((ulong)uVar71 >> 0x30);
          sVar30 = (short)((unkuint10)auVar72._0_10_ >> 0x40);
          sVar31 = auVar72._10_2_;
          sVar32 = auVar73._12_2_;
          sVar33 = auVar76._14_2_;
          lVar1 = lVar54 * 2;
          local_4b8[lVar1] = (0 < sVar60) * (sVar60 < 0x100) * cVar4 - (0xff < sVar60);
          local_4b8[lVar1 + 1] = (0 < sVar20) * (sVar20 < 0x100) * cVar5 - (0xff < sVar20);
          local_4b8[lVar1 + 2] = (0 < sVar21) * (sVar21 < 0x100) * cVar6 - (0xff < sVar21);
          local_4b8[lVar1 + 3] = (0 < sVar22) * (sVar22 < 0x100) * cVar7 - (0xff < sVar22);
          local_4b8[lVar1 + 4] = (0 < sVar23) * (sVar23 < 0x100) * cVar8 - (0xff < sVar23);
          local_4b8[lVar1 + 5] = (0 < sVar24) * (sVar24 < 0x100) * cVar9 - (0xff < sVar24);
          local_4b8[lVar1 + 6] = (0 < sVar25) * (sVar25 < 0x100) * cVar10 - (0xff < sVar25);
          local_4b8[lVar1 + 7] = (0 < sVar26) * (sVar26 < 0x100) * cVar11 - (0xff < sVar26);
          local_4b8[lVar1 + 8] = (0 < sVar68) * (sVar68 < 0x100) * cVar12 - (0xff < sVar68);
          local_4b8[lVar1 + 9] = (0 < sVar27) * (sVar27 < 0x100) * cVar13 - (0xff < sVar27);
          local_4b8[lVar1 + 10] = (0 < sVar28) * (sVar28 < 0x100) * cVar14 - (0xff < sVar28);
          local_4b8[lVar1 + 0xb] = (0 < sVar29) * (sVar29 < 0x100) * cVar15 - (0xff < sVar29);
          local_4b8[lVar1 + 0xc] = (0 < sVar30) * (sVar30 < 0x100) * cVar16 - (0xff < sVar30);
          local_4b8[lVar1 + 0xd] = (0 < sVar31) * (sVar31 < 0x100) * cVar17 - (0xff < sVar31);
          local_4b8[lVar1 + 0xe] = (0 < sVar32) * (sVar32 < 0x100) * cVar18 - (0xff < sVar32);
          local_4b8[lVar1 + 0xf] = (0 < sVar33) * (sVar33 < 0x100) * cVar19 - (0xff < sVar33);
          lVar54 = lVar54 + 8;
        } while (lVar54 != 0x40);
        ndiCommand(pol,"PVWR:%02X%04X%.128s",port,uVar55 & 0xffffffff,local_4b8);
        if (pol->ErrorCode != 0) {
          return -1;
        }
        __s = __s + 0x40;
        bVar3 = uVar55 < 0x3c0;
        uVar55 = uVar55 + 0x40;
      } while (bVar3);
      iVar56 = 0;
    }
  }
  return iVar56;
}

Assistant:

ndicapiExport int ndiPVWRFromFile(ndicapi* pol, int port, char* filename)
{
  unsigned char buffer[1024];
  char hexdata[128];
  FILE* file;
  int addr;

  pol->ErrorCode = 0;

  file = fopen(filename, "rb");
  if (file == NULL)
  {
    return -1;
  }

  memset(buffer, 0, 1024);      // clear buffer to zero
  fread(buffer, 1, 1024, file); // read at most 1k from file
  if (ferror(file))
  {
    fclose(file);
    return -1;
  }
  fclose(file);

  for (addr = 0; addr < 1024; addr += 64)   // write in chunks of 64 bytes
  {
    ndiPVWR(pol, port, addr, ndiHexEncode(hexdata, &buffer[addr], 64));
    if (ndiGetError(pol) != NDI_OKAY)
    {
      return -1;
    }
  }

  return 0;
}